

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O0

void __thiscall TreeWalker::acceptConnections(TreeWalker *this,DomConnections *connections)

{
  QList<DomConnection_*> *this_00;
  const_reference ppDVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  DomConnections *in_stack_ffffffffffffff98;
  int local_4c;
  QList<DomConnection_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  while( true ) {
    this_00 = (QList<DomConnection_*> *)(long)local_4c;
    DomConnections::elementConnection(in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 = (DomConnections *)QList<DomConnection_*>::size(&local_20);
    QList<DomConnection_*>::~QList((QList<DomConnection_*> *)0x198f13);
    if ((long)in_stack_ffffffffffffff98 <= (long)this_00) break;
    DomConnections::elementConnection(in_stack_ffffffffffffff98);
    ppDVar1 = QList<DomConnection_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff98);
    (**(code **)(*in_RDI + 0xf0))(in_RDI,*ppDVar1);
    QList<DomConnection_*>::~QList((QList<DomConnection_*> *)0x198f5a);
    local_4c = local_4c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TreeWalker::acceptConnections(DomConnections *connections)
{
    for (int i=0; i<connections->elementConnection().size(); ++i)
        acceptConnection(connections->elementConnection().at(i));
}